

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc)

{
  int i;
  long lVar1;
  aom_cdf_prob (*paaVar2) [11];
  int i_2;
  ulong uVar3;
  aom_cdf_prob *cdf_ptr;
  ulong uVar4;
  int nsymbs;
  aom_cdf_prob (*cdf_ptr_00) [5] [9];
  
  for (lVar1 = 4; lVar1 != 0x18a; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar1) = 0;
  }
  for (lVar1 = 0x18a; lVar1 != 0x3a6; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->dc_sign_cdf[0][0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0xc) {
    *(undefined2 *)((long)fc->eob_flag_cdf16[0][0] + lVar1 + 10) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 0xe) {
    *(undefined2 *)((long)fc->eob_flag_cdf32[0][0] + lVar1 + 0xc) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *(undefined2 *)((long)fc->eob_flag_cdf64[0][0] + lVar1 + 0xe) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 0x12) {
    *(undefined2 *)((long)fc->eob_flag_cdf128[0][0] + lVar1 + 0x10) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x50; lVar1 = lVar1 + 0x14) {
    *(undefined2 *)((long)fc->eob_flag_cdf256[0][0] + lVar1 + 0x12) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x58; lVar1 = lVar1 + 0x16) {
    *(undefined2 *)((long)fc->eob_flag_cdf512[0][0] + lVar1 + 0x14) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    *(undefined2 *)((long)fc->eob_flag_cdf1024[0][0] + lVar1 + 0x16) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 1) {
    fc->coeff_base_eob_cdf[0][0][lVar1][3] = 0;
  }
  for (lVar1 = 0x706; lVar1 != 0x176e; lVar1 = lVar1 + 10) {
    *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x834; lVar1 = lVar1 + 10) {
    *(undefined2 *)((long)fc->coeff_br_cdf[0][0][0] + lVar1 + 8) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->newmv_cdf[0] + lVar1 + 4) = 0;
  }
  fc->zeromv_cdf[0][2] = 0;
  fc->zeromv_cdf[1][2] = 0;
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->refmv_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->drl_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x90; lVar1 = lVar1 + 0x12) {
    *(undefined2 *)((long)fc->inter_compound_mode_cdf[0] + lVar1 + 0x10) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x84; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->compound_type_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x2ec; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->wedge_idx_cdf[0] + lVar1 + 0x20) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->interintra_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x84; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->wedge_interintra_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 10) {
    *(undefined2 *)((long)fc->interintra_mode_cdf[0] + lVar1 + 8) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x16; lVar1 = lVar1 + 1) {
    fc->motion_mode_cdf[lVar1][3] = 0;
  }
  for (lVar1 = 0; lVar1 != 0x84; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->obmc_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x70; lVar1 = lVar1 + 0x10) {
    *(undefined2 *)((long)fc->palette_y_size_cdf[0] + lVar1 + 0xe) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x70; lVar1 = lVar1 + 0x10) {
    *(undefined2 *)((long)fc->palette_uv_size_cdf[0] + lVar1 + 0xe) = 0;
  }
  cdf_ptr_00 = fc->palette_uv_color_index_cdf;
  for (lVar1 = -7; lVar1 != 0; lVar1 = lVar1 + 1) {
    nsymbs = (int)lVar1 + 9;
    reset_cdf_symbol_counter((aom_cdf_prob *)(cdf_ptr_00 + -7),5,9,nsymbs);
    reset_cdf_symbol_counter((aom_cdf_prob *)cdf_ptr_00,5,9,nsymbs);
    cdf_ptr_00 = cdf_ptr_00 + 1;
  }
  for (lVar1 = 0; lVar1 != 0x7e; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->palette_y_mode_cdf[0][0] + lVar1 + 4) = 0;
  }
  fc->palette_uv_mode_cdf[0][2] = 0;
  fc->palette_uv_mode_cdf[1][2] = 0;
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->comp_inter_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x6c; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->single_ref_cdf[0][0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->comp_ref_type_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x36; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->uni_comp_ref_cdf[0][0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x36; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->comp_ref_cdf[0][0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->comp_bwdref_cdf[0][0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x7e; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->txfm_partition_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->compound_index_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x24; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->comp_group_idx_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->skip_mode_cdfs[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->skip_txfm_cdfs[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->intra_inter_cdf[0] + lVar1 + 4) = 0;
  }
  reset_nmv_counter(&fc->nmvc);
  reset_nmv_counter(&fc->ndvc);
  fc->intrabc_cdf[2] = 0;
  for (lVar1 = 0; lVar1 != 0x12; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)(fc->seg).pred_cdf[0] + lVar1 + 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x36; lVar1 = lVar1 + 0x12) {
    *(undefined2 *)((long)(fc->seg).spatial_pred_seg_cdf[0] + lVar1 + 0x10) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x84; lVar1 = lVar1 + 6) {
    *(undefined2 *)((long)fc->filter_intra_cdfs[0] + lVar1 + 4) = 0;
  }
  fc->filter_intra_mode_cdf[5] = 0;
  fc->switchable_restore_cdf[3] = 0;
  fc->wiener_restore_cdf[2] = 0;
  fc->sgrproj_restore_cdf[2] = 0;
  for (lVar1 = 0; lVar1 != 0x70; lVar1 = lVar1 + 0x1c) {
    *(undefined2 *)((long)fc->y_mode_cdf[0] + lVar1 + 0x1a) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x186; lVar1 = lVar1 + 0x1e) {
    *(undefined2 *)((long)fc->uv_mode_cdf[0][0] + lVar1 + 0x1a) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x186; lVar1 = lVar1 + 0x1e) {
    *(undefined2 *)((long)fc->uv_mode_cdf[1][0] + lVar1 + 0x1c) = 0;
  }
  paaVar2 = fc->partition_cdf;
  for (uVar3 = 0; uVar3 != 0x14; uVar3 = uVar3 + 1) {
    uVar4 = (ulong)((uVar3 < 0x10) + 8 + (uint)(uVar3 < 0x10));
    if (uVar3 < 4) {
      uVar4 = 4;
    }
    (*paaVar2)[uVar4] = 0;
    paaVar2 = paaVar2 + 1;
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    fc->switchable_interp_cdf[lVar1][3] = 0;
  }
  for (lVar1 = 0; lVar1 != 700; lVar1 = lVar1 + 0x1c) {
    *(undefined2 *)((long)fc->kf_y_cdf[0][0] + lVar1 + 0x1a) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    *(undefined2 *)((long)fc->angle_delta_cdf[0] + lVar1 + 0xe) = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fc->tx_size_cdf[0][lVar1][2] = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fc->tx_size_cdf[1][lVar1][3] = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fc->delta_q_cdf[lVar1 * 4 + -0x15] = 0;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fc->delta_q_cdf[lVar1 * 4 + -9] = 0;
  }
  fc->delta_q_cdf[4] = 0;
  fc->delta_lf_cdf[4] = 0;
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 10) {
    *(undefined2 *)((long)fc->delta_lf_multi_cdf[0] + lVar1 + 8) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x6e8; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->intra_ext_tx_cdf[1][0][0] + lVar1 + 0xe) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x6e8; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->intra_ext_tx_cdf[2][0][0] + lVar1 + 10) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x88; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[1][0] + lVar1 + 0x20) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x88; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[2][0] + lVar1 + 0x18) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x88; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[3][0] + lVar1 + 4) = 0;
  }
  fc->cfl_sign_cdf[8] = 0;
  for (lVar1 = 0; lVar1 != 0xcc; lVar1 = lVar1 + 0x22) {
    *(undefined2 *)((long)fc->cfl_alpha_cdf[0] + lVar1 + 0x20) = 0;
  }
  return;
}

Assistant:

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc) {
  RESET_CDF_COUNTER(fc->txb_skip_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_extra_cdf, 2);
  RESET_CDF_COUNTER(fc->dc_sign_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_flag_cdf16, 5);
  RESET_CDF_COUNTER(fc->eob_flag_cdf32, 6);
  RESET_CDF_COUNTER(fc->eob_flag_cdf64, 7);
  RESET_CDF_COUNTER(fc->eob_flag_cdf128, 8);
  RESET_CDF_COUNTER(fc->eob_flag_cdf256, 9);
  RESET_CDF_COUNTER(fc->eob_flag_cdf512, 10);
  RESET_CDF_COUNTER(fc->eob_flag_cdf1024, 11);
  RESET_CDF_COUNTER(fc->coeff_base_eob_cdf, 3);
  RESET_CDF_COUNTER(fc->coeff_base_cdf, 4);
  RESET_CDF_COUNTER(fc->coeff_br_cdf, BR_CDF_SIZE);
  RESET_CDF_COUNTER(fc->newmv_cdf, 2);
  RESET_CDF_COUNTER(fc->zeromv_cdf, 2);
  RESET_CDF_COUNTER(fc->refmv_cdf, 2);
  RESET_CDF_COUNTER(fc->drl_cdf, 2);
  RESET_CDF_COUNTER(fc->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  RESET_CDF_COUNTER(fc->compound_type_cdf, MASKED_COMPOUND_TYPES);
  RESET_CDF_COUNTER(fc->wedge_idx_cdf, 16);
  RESET_CDF_COUNTER(fc->interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->wedge_interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->interintra_mode_cdf, INTERINTRA_MODES);
  RESET_CDF_COUNTER(fc->motion_mode_cdf, MOTION_MODES);
  RESET_CDF_COUNTER(fc->obmc_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_y_size_cdf, PALETTE_SIZES);
  RESET_CDF_COUNTER(fc->palette_uv_size_cdf, PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    RESET_CDF_COUNTER_STRIDE(fc->palette_y_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
    RESET_CDF_COUNTER_STRIDE(fc->palette_uv_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
  }
  RESET_CDF_COUNTER(fc->palette_y_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_uv_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_inter_cdf, 2);
  RESET_CDF_COUNTER(fc->single_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_type_cdf, 2);
  RESET_CDF_COUNTER(fc->uni_comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_bwdref_cdf, 2);
  RESET_CDF_COUNTER(fc->txfm_partition_cdf, 2);
  RESET_CDF_COUNTER(fc->compound_index_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_group_idx_cdf, 2);
  RESET_CDF_COUNTER(fc->skip_mode_cdfs, 2);
  RESET_CDF_COUNTER(fc->skip_txfm_cdfs, 2);
  RESET_CDF_COUNTER(fc->intra_inter_cdf, 2);
  reset_nmv_counter(&fc->nmvc);
  reset_nmv_counter(&fc->ndvc);
  RESET_CDF_COUNTER(fc->intrabc_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.pred_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  RESET_CDF_COUNTER(fc->filter_intra_cdfs, 2);
  RESET_CDF_COUNTER(fc->filter_intra_mode_cdf, FILTER_INTRA_MODES);
  RESET_CDF_COUNTER(fc->switchable_restore_cdf, RESTORE_SWITCHABLE_TYPES);
  RESET_CDF_COUNTER(fc->wiener_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->sgrproj_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->y_mode_cdf, INTRA_MODES);
  RESET_CDF_COUNTER_STRIDE(fc->uv_mode_cdf[0], UV_INTRA_MODES - 1,
                           CDF_SIZE(UV_INTRA_MODES));
  RESET_CDF_COUNTER(fc->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 4, CDF_SIZE(10));
    } else if (i < 16) {
      RESET_CDF_COUNTER(fc->partition_cdf[i], 10);
    } else {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 8, CDF_SIZE(10));
    }
  }
  RESET_CDF_COUNTER(fc->switchable_interp_cdf, SWITCHABLE_FILTERS);
  RESET_CDF_COUNTER(fc->kf_y_cdf, INTRA_MODES);
  RESET_CDF_COUNTER(fc->angle_delta_cdf, 2 * MAX_ANGLE_DELTA + 1);
  RESET_CDF_COUNTER_STRIDE(fc->tx_size_cdf[0], MAX_TX_DEPTH,
                           CDF_SIZE(MAX_TX_DEPTH + 1));
  RESET_CDF_COUNTER(fc->tx_size_cdf[1], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[2], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[3], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->delta_q_cdf, DELTA_Q_PROBS + 1);
  RESET_CDF_COUNTER(fc->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    RESET_CDF_COUNTER(fc->delta_lf_multi_cdf[i], DELTA_LF_PROBS + 1);
  }
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[1], 7, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[2], 5, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[1], 16, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[2], 12, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[3], 2, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER(fc->cfl_sign_cdf, CFL_JOINT_SIGNS);
  RESET_CDF_COUNTER(fc->cfl_alpha_cdf, CFL_ALPHABET_SIZE);
}